

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EnsureYield(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  undefined8 uVar1;
  EmitInfo dst;
  uint32 i;
  uint32 index;
  PolymorphicEmitInfo PVar2;
  undefined1 auStack_38 [8];
  PolymorphicEmitInfo yieldEmitInfo;
  
  yieldEmitInfo.count = 0;
  yieldEmitInfo._4_4_ = 0;
  if ((blockInfo->yieldInfo).count == 0) {
    uVar1._0_4_ = 0;
  }
  else {
    uVar1._0_4_ = (blockInfo->yieldInfo).count;
    uVar1._4_4_ = *(undefined4 *)&(blockInfo->yieldInfo).field_0x4;
    yieldEmitInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    if (blockInfo->didYield == false) {
      blockInfo->didYield = true;
      auStack_38 = (undefined1  [8])uVar1;
      for (index = 0; (uint32)uVar1 != index; index = index + 1) {
        dst = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_38,index);
        EmitLoadConst(this,dst,(WasmConstLitNode)ZEXT816(0));
      }
    }
  }
  PVar2._4_4_ = 0;
  PVar2.count = (uint32)uVar1;
  PVar2.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldEmitInfo._0_8_;
  return PVar2;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EnsureYield(BlockInfo* blockInfo)
{
    PolymorphicEmitInfo yieldEmitInfo;
    if (blockInfo->HasYield())
    {
        yieldEmitInfo = blockInfo->yieldInfo;
        if (!blockInfo->DidYield())
        {
            // Emit a load to the yield location to make sure we have a dest there
            // Most likely we can't reach this code so the value doesn't matter
            blockInfo->didYield = true;
            for (uint32 i = 0; i < yieldEmitInfo.Count(); ++i)
            {
                EmitLoadConst(yieldEmitInfo.GetInfo(i), GetZeroCnst());
            }
        }
    }
    return yieldEmitInfo;
}